

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_18::FunctionInfoScanner::visitFunction(FunctionInfoScanner *this,Function *curr)

{
  Type *this_00;
  mapped_type *pmVar1;
  bool bVar2;
  Index IVar3;
  size_t sVar4;
  Type *pTVar5;
  bool bVar6;
  Signature SVar7;
  Type local_50;
  mapped_type *local_48;
  Iterator local_40;
  
  local_48 = std::
             unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
             ::operator[](this->infos,(key_type *)curr);
  SVar7 = HeapType::getSignature(&curr->type);
  local_50 = SVar7.params.id;
  this_00 = &local_50;
  local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
  local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = this_00;
  sVar4 = wasm::Type::size(this_00);
  bVar6 = local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
          this_00 &&
          local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index ==
          sVar4;
  if (local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent != this_00
      || local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != sVar4
     ) {
    pTVar5 = wasm::Type::Iterator::operator*(&local_40);
    bVar2 = TypeUpdating::canHandleAsLocal((Type)pTVar5->id);
    if (bVar2) {
      do {
        local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 1;
        bVar6 = local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                == this_00 &&
                local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                == sVar4;
        if (bVar6) break;
        pTVar5 = wasm::Type::Iterator::operator*(&local_40);
        bVar2 = TypeUpdating::canHandleAsLocal((Type)pTVar5->id);
      } while (bVar2);
    }
  }
  pmVar1 = local_48;
  if (!bVar6) {
    local_48->inliningMode = Uninlineable;
  }
  IVar3 = Measurer::measure(curr->body);
  pmVar1->size = IVar3;
  if ((curr->body->_id == CallId) && (curr->body[1].type.id + 1 == (ulong)IVar3)) {
    pmVar1->isTrivialCall = true;
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    auto& info = infos[curr->name];

    if (!canHandleParams(curr)) {
      info.inliningMode = InliningMode::Uninlineable;
    }

    info.size = Measurer::measure(curr->body);

    if (auto* call = curr->body->dynCast<Call>()) {
      if (info.size == call->operands.size() + 1) {
        // This function body is a call with some trivial (size 1) operands like
        // LocalGet or Const, so it is a trivial call.
        info.isTrivialCall = true;
      }
    }
  }